

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshBuffer.h
# Opt level: O0

void __thiscall
irr::scene::CMeshBuffer<irr::video::S3DVertex>::CMeshBuffer
          (CMeshBuffer<irr::video::S3DVertex> *this)

{
  array<irr::video::S3DVertex> *in_RDI;
  SMaterial *unaff_retaddr;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI[9].is_sorted);
  IMeshBuffer::IMeshBuffer((IMeshBuffer *)in_RDI,&PTR_construction_vtable_24__004379c0);
  (in_RDI->m_data).super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x437888;
  *(undefined8 *)&in_RDI[9].is_sorted = 0x4379a8;
  *(undefined4 *)
   &(in_RDI->m_data).
    super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
    super__Vector_impl_data._M_finish = 1;
  *(undefined4 *)
   ((long)&(in_RDI->m_data).
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_finish + 4) = 1;
  *(undefined4 *)
   &(in_RDI->m_data).
    super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined4 *)
   ((long)&(in_RDI->m_data).
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)&in_RDI->is_sorted = 0;
  video::SMaterial::SMaterial(unaff_retaddr);
  core::array<irr::video::S3DVertex>::array(in_RDI);
  core::array<unsigned_short>::array((array<unsigned_short> *)in_RDI);
  core::aabbox3d<float>::aabbox3d((aabbox3d<float> *)in_RDI);
  *(undefined4 *)
   &in_RDI[9].m_data.
    super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 6;
  return;
}

Assistant:

CMeshBuffer() :
			ChangedID_Vertex(1), ChangedID_Index(1), MappingHint_Vertex(EHM_NEVER), MappingHint_Index(EHM_NEVER), HWBuffer(NULL), PrimitiveType(EPT_TRIANGLES)
	{
#ifdef _DEBUG
		setDebugName("CMeshBuffer");
#endif
	}